

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_AddCommand(cmsysProcess *cp,char **command)

{
  long *plVar1;
  int iVar2;
  int i;
  char ***__ptr;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  long lVar6;
  size_t __size;
  
  if (command == (char **)0x0 || cp == (cmsysProcess *)0x0) {
    return 0;
  }
  pcVar5 = *command;
  if (pcVar5 == (char *)0x0) {
    return 0;
  }
  iVar2 = cp->NumberOfCommands;
  __ptr = (char ***)malloc((long)iVar2 * 8 + 8);
  if (__ptr == (char ***)0x0) {
    return 0;
  }
  for (lVar3 = 0; lVar3 < cp->NumberOfCommands; lVar3 = lVar3 + 1) {
    __ptr[lVar3] = cp->Commands[lVar3];
  }
  if (cp->Verbatim == 0) {
    __size = 0;
    do {
      plVar1 = (long *)((long)command + __size);
      __size = __size + 8;
    } while (*plVar1 != 0);
    ppcVar4 = (char **)malloc(__size);
    __ptr[cp->NumberOfCommands] = ppcVar4;
    if (__ptr[cp->NumberOfCommands] == (char **)0x0) goto LAB_00120219;
    lVar3 = ((long)__size >> 3) + -1;
    lVar6 = 0;
    if (lVar3 < 1) {
      lVar3 = lVar6;
    }
    for (; lVar3 != lVar6; lVar6 = lVar6 + 1) {
      if (command[lVar6] == (char *)0x0) {
        __assert_fail("command[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/kwsys/ProcessUNIX.c"
                      ,0x1cc,"int cmsysProcess_AddCommand(cmsysProcess *, const char *const *)");
      }
      pcVar5 = strdup(command[lVar6]);
      __ptr[cp->NumberOfCommands][lVar6] = pcVar5;
      if (__ptr[cp->NumberOfCommands][lVar6] == (char *)0x0) goto LAB_00120214;
    }
    __ptr[cp->NumberOfCommands][((long)__size >> 3) + -1] = (char *)0x0;
  }
  else {
    ppcVar4 = cmsysSystem_Parse_CommandForUnix(pcVar5,0);
    __ptr[cp->NumberOfCommands] = ppcVar4;
    if ((__ptr[cp->NumberOfCommands] == (char **)0x0) ||
       (*__ptr[cp->NumberOfCommands] == (char *)0x0)) {
      free(__ptr);
      return 0;
    }
  }
  free(cp->Commands);
  cp->Commands = __ptr;
  cp->NumberOfCommands = iVar2 + 1;
  return 1;
LAB_00120214:
  for (; 0 < lVar6; lVar6 = lVar6 + -1) {
    free(__ptr[cp->NumberOfCommands][lVar6 + -1]);
  }
LAB_00120219:
  free(__ptr);
  return 0;
}

Assistant:

int kwsysProcess_AddCommand(kwsysProcess* cp, char const* const* command)
{
  int newNumberOfCommands;
  char*** newCommands;

  /* Make sure we have a command to add.  */
  if (!cp || !command || !*command) {
    return 0;
  }

  /* Allocate a new array for command pointers.  */
  newNumberOfCommands = cp->NumberOfCommands + 1;
  if (!(newCommands =
          (char***)malloc(sizeof(char**) * (size_t)(newNumberOfCommands)))) {
    /* Out of memory.  */
    return 0;
  }

  /* Copy any existing commands into the new array.  */
  {
    int i;
    for (i = 0; i < cp->NumberOfCommands; ++i) {
      newCommands[i] = cp->Commands[i];
    }
  }

  /* Add the new command.  */
  if (cp->Verbatim) {
    /* In order to run the given command line verbatim we need to
       parse it.  */
    newCommands[cp->NumberOfCommands] =
      kwsysSystem_Parse_CommandForUnix(*command, 0);
    if (!newCommands[cp->NumberOfCommands] ||
        !newCommands[cp->NumberOfCommands][0]) {
      /* Out of memory or no command parsed.  */
      free(newCommands);
      return 0;
    }
  } else {
    /* Copy each argument string individually.  */
    char const* const* c = command;
    kwsysProcess_ptrdiff_t n = 0;
    kwsysProcess_ptrdiff_t i = 0;
    while (*c++) {
    }
    n = c - command - 1;
    newCommands[cp->NumberOfCommands] =
      (char**)malloc((size_t)(n + 1) * sizeof(char*));
    if (!newCommands[cp->NumberOfCommands]) {
      /* Out of memory.  */
      free(newCommands);
      return 0;
    }
    for (i = 0; i < n; ++i) {
      assert(command[i]); /* Quiet Clang scan-build. */
      newCommands[cp->NumberOfCommands][i] = strdup(command[i]);
      if (!newCommands[cp->NumberOfCommands][i]) {
        break;
      }
    }
    if (i < n) {
      /* Out of memory.  */
      for (; i > 0; --i) {
        free(newCommands[cp->NumberOfCommands][i - 1]);
      }
      free(newCommands);
      return 0;
    }
    newCommands[cp->NumberOfCommands][n] = 0;
  }

  /* Successfully allocated new command array.  Free the old array. */
  free(cp->Commands);
  cp->Commands = newCommands;
  cp->NumberOfCommands = newNumberOfCommands;

  return 1;
}